

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

bool __thiscall CS248::Shader::prepareSourceCode(Shader *this,string *filename,string *out_source)

{
  bool bVar1;
  string *in_RDX;
  string version;
  string *in_stack_000001e0;
  string *in_stack_000001e8;
  string local_78 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  allocator local_41;
  string local_40 [32];
  string *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  bVar1 = anon_unknown_13::readFile(in_stack_000001e8,in_stack_000001e0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"#version 130\n",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::__cxx11::string::operator=(local_20,local_78);
    std::__cxx11::string::~string(local_78);
    local_1 = 1;
    std::__cxx11::string::~string(local_40);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Shader::prepareSourceCode(const std::string& filename, std::string* out_source) {
  if (!readFile(filename, *out_source)) {
    return false;
  }
#ifdef __APPLE__
  std::string version = "#version 150\n";
#else
  std::string version = "#version 130\n";
#endif 
  *out_source  = version + (*out_source);
  return true;
}